

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::satisfied(Solver *this,Clause *c)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int i;
  ulong uVar4;
  lbool local_2b;
  lbool local_2a;
  lbool local_29;
  
  if ((this->assumptions).sz == 0) {
    uVar4 = 0;
    do {
      bVar3 = uVar4 < (ulong)c->header >> 0x22;
      if (!bVar3) {
        return bVar3;
      }
      iVar1 = *(int *)(&c[1].header.field_0x0 + uVar4 * 4);
      local_2b.value = (byte)iVar1 & 1 ^ (this->assigns).data[iVar1 >> 1].value;
      bVar2 = lbool::operator==(&local_2b,(lbool)0x0);
      uVar4 = uVar4 + 1;
    } while (!bVar2);
  }
  else {
    local_29.value =
         (byte)*(int *)&c[1].header & 1 ^ (this->assigns).data[*(int *)&c[1].header >> 1].value;
    bVar2 = lbool::operator==(&local_29,(lbool)0x0);
    bVar3 = true;
    if (!bVar2) {
      iVar1 = *(int *)&c[1].header.field_0x4;
      local_2a.value = (byte)iVar1 & 1 ^ (this->assigns).data[iVar1 >> 1].value;
      bVar3 = lbool::operator==(&local_2a,(lbool)0x0);
    }
  }
  return bVar3;
}

Assistant:

bool Solver::satisfied(const Clause &c) const
{
    if (assumptions.size()) // Check clauses with many selectors is too time consuming
        return (value(c[0]) == l_True) || (value(c[1]) == l_True);

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True) return true;
    return false;
}